

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O0

EStatusCode __thiscall
PDFDocumentHandler::MergePDFPagesToPageInContext
          (PDFDocumentHandler *this,PDFPage *inPage,PDFPageRange *inPageRange,
          ObjectIDTypeList *inCopyAdditionalObjects)

{
  ulong uVar1;
  unsigned_long uVar2;
  iterator iVar3;
  const_iterator cVar4;
  bool bVar5;
  size_type sVar6;
  Trace *pTVar7;
  _List_node_base *p_Var8;
  pointer ppVar9;
  unsigned_long uVar10;
  unsigned_long uVar11;
  reference ppIVar12;
  _Self local_70;
  _Self local_68;
  iterator it;
  unsigned_long i_1;
  _Self local_50;
  const_iterator it_2;
  unsigned_long i;
  _Self local_38;
  iterator it_1;
  EStatusCode status;
  ObjectIDTypeList *inCopyAdditionalObjects_local;
  PDFPageRange *inPageRange_local;
  PDFPage *inPage_local;
  PDFDocumentHandler *this_local;
  
  it_1._M_node._4_4_ = eSuccess;
  local_38._M_node =
       (_Base_ptr)
       std::
       set<IDocumentContextExtender_*,_std::less<IDocumentContextExtender_*>,_std::allocator<IDocumentContextExtender_*>_>
       ::begin(&this->mExtenders);
  while( true ) {
    i = (unsigned_long)
        std::
        set<IDocumentContextExtender_*,_std::less<IDocumentContextExtender_*>,_std::allocator<IDocumentContextExtender_*>_>
        ::end(&this->mExtenders);
    bVar5 = std::operator!=(&local_38,(_Self *)&i);
    if (!bVar5 || it_1._M_node._4_4_ != eSuccess) break;
    ppIVar12 = std::_Rb_tree_const_iterator<IDocumentContextExtender_*>::operator*(&local_38);
    it_1._M_node._4_4_ =
         (*(*ppIVar12)->_vptr_IDocumentContextExtender[9])
                   (*ppIVar12,this->mObjectsContext,this->mDocumentContext);
    if (it_1._M_node._4_4_ != eSuccess) {
      pTVar7 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar7,
                        "DocumentContext::MergePDFPagesToPage, unexpected failure. extender declared failure after parsing page."
                       );
    }
    std::_Rb_tree_const_iterator<IDocumentContextExtender_*>::operator++(&local_38);
  }
  sVar6 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::size
                    (inCopyAdditionalObjects);
  if ((sVar6 == 0) ||
     (it_1._M_node._4_4_ = WriteNewObjects(this,inCopyAdditionalObjects),
     it_1._M_node._4_4_ == eSuccess)) {
    if (inPageRange->mType == eRangeTypeAll) {
      for (it_2._M_node = (_List_node_base *)0x0; cVar4._M_node = it_2._M_node,
          p_Var8 = (_List_node_base *)PDFParser::GetPagesCount(this->mParser),
          cVar4._M_node < p_Var8 && it_1._M_node._4_4_ == eSuccess;
          it_2._M_node = (_List_node_base *)((long)&(it_2._M_node)->_M_next + 1)) {
        it_1._M_node._4_4_ = MergePDFPageForPage(this,inPage,(unsigned_long)it_2._M_node);
        if (it_1._M_node._4_4_ != eSuccess) {
          pTVar7 = Trace::DefaultTrace();
          Trace::TraceToLog(pTVar7,
                            "PDFDocumentHandler::MergePDFPagesToPage, failed to embed page %ld",
                            it_2._M_node);
        }
      }
    }
    else {
      local_50._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ::begin(&inPageRange->mSpecificRanges);
      while( true ) {
        i_1 = (unsigned_long)
              std::__cxx11::
              list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::end(&inPageRange->mSpecificRanges);
        bVar5 = std::operator!=(&local_50,(_Self *)&i_1);
        if (!bVar5 || it_1._M_node._4_4_ != eSuccess) break;
        ppVar9 = std::_List_const_iterator<std::pair<unsigned_long,_unsigned_long>_>::operator->
                           (&local_50);
        uVar1 = ppVar9->first;
        ppVar9 = std::_List_const_iterator<std::pair<unsigned_long,_unsigned_long>_>::operator->
                           (&local_50);
        if (ppVar9->second < uVar1) {
LAB_0023c0bf:
          pTVar7 = Trace::DefaultTrace();
          ppVar9 = std::_List_const_iterator<std::pair<unsigned_long,_unsigned_long>_>::operator->
                             (&local_50);
          uVar10 = ppVar9->first;
          ppVar9 = std::_List_const_iterator<std::pair<unsigned_long,_unsigned_long>_>::operator->
                             (&local_50);
          uVar2 = ppVar9->second;
          uVar11 = PDFParser::GetPagesCount(this->mParser);
          Trace::TraceToLog(pTVar7,
                            "PDFDocumentHandler::MergePDFPagesToPage, range mismatch. first = %ld, second = %ld, PDF page count = %ld"
                            ,uVar10,uVar2,uVar11);
          it_1._M_node._4_4_ = eFailure;
        }
        else {
          ppVar9 = std::_List_const_iterator<std::pair<unsigned_long,_unsigned_long>_>::operator->
                             (&local_50);
          uVar1 = ppVar9->second;
          uVar10 = PDFParser::GetPagesCount(this->mParser);
          if (uVar10 <= uVar1) goto LAB_0023c0bf;
          ppVar9 = std::_List_const_iterator<std::pair<unsigned_long,_unsigned_long>_>::operator->
                             (&local_50);
          for (it._M_node = (_Base_ptr)ppVar9->first; iVar3._M_node = it._M_node,
              ppVar9 = std::_List_const_iterator<std::pair<unsigned_long,_unsigned_long>_>::
                       operator->(&local_50),
              iVar3._M_node <= (_Base_ptr)ppVar9->second && it_1._M_node._4_4_ == eSuccess;
              it._M_node = (_Base_ptr)((long)&(it._M_node)->_M_color + 1)) {
            it_1._M_node._4_4_ = MergePDFPageForPage(this,inPage,(unsigned_long)it._M_node);
            if (it_1._M_node._4_4_ != eSuccess) {
              pTVar7 = Trace::DefaultTrace();
              Trace::TraceToLog(pTVar7,
                                "PDFDocumentHandler::MergePDFPagesToPage, failed to embed page %ld",
                                it._M_node);
            }
          }
        }
        std::_List_const_iterator<std::pair<unsigned_long,_unsigned_long>_>::operator++(&local_50);
      }
    }
  }
  else {
    pTVar7 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar7,
                      "PDFDocumentHandler::MergePDFPagesToPage, failed copying additional objects");
  }
  local_68._M_node =
       (_Base_ptr)
       std::
       set<IDocumentContextExtender_*,_std::less<IDocumentContextExtender_*>,_std::allocator<IDocumentContextExtender_*>_>
       ::begin(&this->mExtenders);
  while( true ) {
    local_70._M_node =
         (_Base_ptr)
         std::
         set<IDocumentContextExtender_*,_std::less<IDocumentContextExtender_*>,_std::allocator<IDocumentContextExtender_*>_>
         ::end(&this->mExtenders);
    bVar5 = std::operator!=(&local_68,&local_70);
    if (!bVar5 || it_1._M_node._4_4_ != eSuccess) break;
    ppIVar12 = std::_Rb_tree_const_iterator<IDocumentContextExtender_*>::operator*(&local_68);
    it_1._M_node._4_4_ =
         (*(*ppIVar12)->_vptr_IDocumentContextExtender[0x10])
                   (*ppIVar12,this->mObjectsContext,this->mDocumentContext);
    if (it_1._M_node._4_4_ != eSuccess) {
      pTVar7 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar7,
                        "DocumentContext::MergePDFPagesToPage, unexpected failure. extender declared failure before finalizing copy."
                       );
    }
    std::_Rb_tree_const_iterator<IDocumentContextExtender_*>::operator++(&local_68);
  }
  StopCopyingContext(this);
  return it_1._M_node._4_4_;
}

Assistant:

EStatusCode PDFDocumentHandler::MergePDFPagesToPageInContext(PDFPage* inPage,
															const PDFPageRange& inPageRange,
															const ObjectIDTypeList& inCopyAdditionalObjects)
{
	EStatusCode status = PDFHummus::eSuccess;

	do
	{
		IDocumentContextExtenderSet::iterator it = mExtenders.begin();
		for(; it != mExtenders.end() && PDFHummus::eSuccess == status; ++it)
		{
			status = (*it)->OnPDFParsingComplete(mObjectsContext,mDocumentContext,this);
			if(status != PDFHummus::eSuccess)
				TRACE_LOG("DocumentContext::MergePDFPagesToPage, unexpected failure. extender declared failure after parsing page.");
		}

	// copy additional objects prior to pages, so we have them ready at page merging
		if(inCopyAdditionalObjects.size() > 0)
		{
			status = WriteNewObjects(inCopyAdditionalObjects);
			if(status != PDFHummus::eSuccess)
			{
				TRACE_LOG("PDFDocumentHandler::MergePDFPagesToPage, failed copying additional objects");
				break;
			}
		}

		if(PDFPageRange::eRangeTypeAll == inPageRange.mType)
		{
			for(unsigned long i=0; i < mParser->GetPagesCount() && PDFHummus::eSuccess == status; ++i)
			{
				status = MergePDFPageForPage(inPage,i);
				if(status != PDFHummus::eSuccess)
					TRACE_LOG1("PDFDocumentHandler::MergePDFPagesToPage, failed to embed page %ld", i);
			}
		}
		else
		{
			// eRangeTypeSpecific
			ULongAndULongList::const_iterator it = inPageRange.mSpecificRanges.begin();
			for(; it != inPageRange.mSpecificRanges.end() && PDFHummus::eSuccess == status;++it)
			{
				if(it->first <= it->second && it->second < mParser->GetPagesCount())
				{
					for(unsigned long i=it->first; i <= it->second && PDFHummus::eSuccess == status; ++i)
					{
						status = MergePDFPageForPage(inPage,i);
						if(status != PDFHummus::eSuccess)
							TRACE_LOG1("PDFDocumentHandler::MergePDFPagesToPage, failed to embed page %ld", i);
					}
				}
				else
				{
					TRACE_LOG3("PDFDocumentHandler::MergePDFPagesToPage, range mismatch. first = %ld, second = %ld, PDF page count = %ld", 
						it->first,
						it->second,
						mParser->GetPagesCount());
					status = PDFHummus::eFailure;
				}
			}
		}


	}while(false);

	IDocumentContextExtenderSet::iterator it = mExtenders.begin();
	for(; it != mExtenders.end() && PDFHummus::eSuccess == status; ++it)
	{
		status = (*it)->OnPDFCopyingComplete(mObjectsContext,mDocumentContext,this);
		if(status != PDFHummus::eSuccess)
			TRACE_LOG("DocumentContext::MergePDFPagesToPage, unexpected failure. extender declared failure before finalizing copy.");
	}

	StopCopyingContext();

	return status;

}